

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

void __thiscall
ON_SHA1::Internal_SwapBigEndianUpdate(ON_SHA1 *this,void *buffer,ON__UINT64 sizeof_buffer)

{
  endian eVar1;
  void *pvVar2;
  void *local_68;
  char *p1;
  char *p0;
  ON__UINT64 sizeof_reversed_buffer;
  ON__UINT64 reversed_buffer_capacity;
  uchar reversed_buffer [32];
  ON__UINT64 sizeof_buffer_local;
  void *buffer_local;
  ON_SHA1 *this_local;
  
  eVar1 = ON::Endian();
  if (((eVar1 == big_endian) && (buffer != (void *)0x0)) && (sizeof_buffer != 0)) {
    local_68 = (void *)((long)buffer + sizeof_buffer);
    while (buffer < local_68) {
      for (p0 = (char *)0x0; p0 < (char *)0x20; p0 = p0 + 1) {
        pvVar2 = (void *)((long)local_68 + -1);
        *(char *)((long)&reversed_buffer_capacity + (long)p0) = *(char *)((long)local_68 + -1);
        local_68 = pvVar2;
        if (buffer == pvVar2) break;
      }
      AccumulateBytes(this,&reversed_buffer_capacity,(ON__UINT64)p0);
    }
  }
  else {
    AccumulateBytes(this,buffer,sizeof_buffer);
  }
  return;
}

Assistant:

void ON_SHA1::Internal_SwapBigEndianUpdate(
  const void* buffer,
  ON__UINT64 sizeof_buffer
)
{
  if (ON::Endian() == ON::endian::big_endian && nullptr != buffer && sizeof_buffer > 0)
  {
    unsigned char reversed_buffer[32];
    const ON__UINT64 reversed_buffer_capacity = (ON__UINT64)sizeof(reversed_buffer);
    ON__UINT64 sizeof_reversed_buffer;
    const char* p0 = (const char*)buffer;
    const char* p1 = p0 + sizeof_buffer;
    while (p0 < p1)
    {
      for (sizeof_reversed_buffer = 0; sizeof_reversed_buffer < reversed_buffer_capacity; sizeof_reversed_buffer++)
      {
        reversed_buffer[sizeof_reversed_buffer] = *--p1;
        if (p0 == p1)
          break;
      }
      AccumulateBytes( reversed_buffer, sizeof_reversed_buffer );
    }
  }
  else
  {
    AccumulateBytes(buffer, sizeof_buffer);
  }
}